

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Maybe<kj::Own<capnp::ClientHook>_> *
kj::_::
CopyConstructArray_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_kj::Maybe<kj::Own<capnp::ClientHook>_>_*,_true,_false>
::apply(Maybe<kj::Own<capnp::ClientHook>_> *pos,Maybe<kj::Own<capnp::ClientHook>_> *start,
       Maybe<kj::Own<capnp::ClientHook>_> *end)

{
  Maybe<kj::Own<capnp::ClientHook>_> *location;
  Maybe<kj::Own<capnp::ClientHook>_> *params;
  undefined1 local_30 [8];
  ExceptionGuard guard;
  Maybe<kj::Own<capnp::ClientHook>_> *end_local;
  Maybe<kj::Own<capnp::ClientHook>_> *start_local;
  Maybe<kj::Own<capnp::ClientHook>_> *pos_local;
  
  guard.pos = end;
  ExceptionGuard::ExceptionGuard((ExceptionGuard *)local_30,pos);
  end_local = start;
  while (location = guard.start, end_local != guard.pos) {
    params = mv<kj::Maybe<kj::Own<capnp::ClientHook>>>(end_local);
    ctor<kj::Maybe<kj::Own<capnp::ClientHook>>,kj::Maybe<kj::Own<capnp::ClientHook>>>
              (location,params);
    guard.start = guard.start + 1;
    end_local = end_local + 1;
  }
  local_30 = (undefined1  [8])guard.start;
  ExceptionGuard::~ExceptionGuard((ExceptionGuard *)local_30);
  return location;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }